

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void ats_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  ulong uVar1;
  uint64_t uVar2;
  ARMMMUIdx mmu_idx;
  long lVar3;
  int line;
  uint uVar4;
  bool bVar5;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar4 = env->uncached_cpsr & 0x1f;
      if (uVar4 == 0x10) {
        uVar4 = 0;
      }
      else if (uVar4 == 0x16) {
LAB_0061d123:
        uVar4 = 3;
      }
      else if (uVar4 == 0x1a) {
        uVar4 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          if (uVar4 == 0x16) {
            uVar4 = 3;
            if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0061d128;
          }
          else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_0061d123;
        }
        uVar4 = 1;
      }
    }
    else {
      uVar4 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((env->v7m).exception == 0) {
      uVar4 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061d128:
  if ((uVar1 & 0x200000000) == 0) {
    bVar5 = false;
  }
  else {
    bVar5 = ((env->cp15).scr_el3 & 1) == 0;
  }
  switch(ri->opc2 & 6) {
  case MMU_DATA_LOAD:
    if (uVar4 != 1) {
      mmu_idx = ARMMMUIdx_SE3;
      if (uVar4 == 3) break;
      if (uVar4 != 2) {
        line = 0xc58;
LAB_0061d275:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                   ,line,(char *)0x0);
      }
      if (bVar5 != false) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                   ,0xc4d,"!secure");
      }
    }
    if ((ri->crm == '\t') && ((env->uncached_cpsr & 0x400000) != 0)) {
      mmu_idx = (uint)(bVar5 ^ 1U) + (uint)(bVar5 ^ 1U) * 8 + ARMMMUIdx_SE10_1_PAN;
    }
    else {
      mmu_idx = (uint)(bVar5 ^ 1U) + (uint)(bVar5 ^ 1U) * 8 + ARMMMUIdx_SE10_1;
    }
    break;
  case MMU_INST_FETCH:
    if (uVar4 == 1) {
      mmu_idx = (uint)(bVar5 ^ 1U) + (uint)(bVar5 ^ 1U) * 8 + ARMMMUIdx_SE10_0;
    }
    else {
      mmu_idx = ARMMMUIdx_SE10_0;
      if (uVar4 != 3) {
        if (uVar4 != 2) {
          line = 0xc69;
          goto LAB_0061d275;
        }
        mmu_idx = ARMMMUIdx_Stage1_E0;
      }
    }
    break;
  case 4:
    mmu_idx = ARMMMUIdx_E10_1;
    break;
  case 6:
    mmu_idx = ARMMMUIdx_E10_0;
  }
  uVar2 = do_ats_write(env,value,ri->opc2 & MMU_DATA_STORE,mmu_idx);
  uVar1 = env->features;
  if ((uVar1 & 0x200000000) != 0) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_0061d22e;
    }
    else if ((~env->pstate & 0xc) != 0) {
LAB_0061d22e:
      if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
        lVar3 = 0x460;
        goto LAB_0061d248;
      }
      goto LAB_0061d243;
    }
    lVar3 = 0x460;
    if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0061d248;
  }
LAB_0061d243:
  lVar3 = 0x450;
LAB_0061d248:
  *(uint64_t *)((long)env->regs + lVar3) = uVar2;
  return;
}

Assistant:

static void ats_write(CPUARMState *env, const ARMCPRegInfo *ri, uint64_t value)
{
    MMUAccessType access_type = ri->opc2 & 1 ? MMU_DATA_STORE : MMU_DATA_LOAD;
    uint64_t par64;
    ARMMMUIdx mmu_idx = 0;
    int el = arm_current_el(env);
    bool secure = arm_is_secure_below_el3(env);

    switch (ri->opc2 & 6) {
    case 0:
        /* stage 1 current state PL1: ATS1CPR, ATS1CPW, ATS1CPRP, ATS1CPWP */
        switch (el) {
        case 3:
            mmu_idx = ARMMMUIdx_SE3;
            break;
        case 2:
            g_assert(!secure);  /* TODO: ARMv8.4-SecEL2 */
            /* fall through */
        case 1:
            if (ri->crm == 9 && (env->uncached_cpsr & CPSR_PAN)) {
                mmu_idx = (secure ? ARMMMUIdx_SE10_1_PAN
                           : ARMMMUIdx_Stage1_E1_PAN);
            } else {
                mmu_idx = secure ? ARMMMUIdx_SE10_1 : ARMMMUIdx_Stage1_E1;
            }
            break;
        default:
            g_assert_not_reached();
            break;
        }
        break;
    case 2:
        /* stage 1 current state PL0: ATS1CUR, ATS1CUW */
        switch (el) {
        case 3:
            mmu_idx = ARMMMUIdx_SE10_0;
            break;
        case 2:
            mmu_idx = ARMMMUIdx_Stage1_E0;
            break;
        case 1:
            mmu_idx = secure ? ARMMMUIdx_SE10_0 : ARMMMUIdx_Stage1_E0;
            break;
        default:
            g_assert_not_reached();
            break;
        }
        break;
    case 4:
        /* stage 1+2 NonSecure PL1: ATS12NSOPR, ATS12NSOPW */
        mmu_idx = ARMMMUIdx_E10_1;
        break;
    case 6:
        /* stage 1+2 NonSecure PL0: ATS12NSOUR, ATS12NSOUW */
        mmu_idx = ARMMMUIdx_E10_0;
        break;
    default:
        g_assert_not_reached();
        break;
    }

    par64 = do_ats_write(env, value, access_type, mmu_idx);

    A32_BANKED_CURRENT_REG_SET(env, par, par64);
}